

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resWin.c
# Opt level: O3

void Res_WinMarkPaths(Res_Win_t *p)

{
  ulong uVar1;
  undefined4 uVar2;
  Abc_Ntk_t *pAVar3;
  long lVar4;
  int *piVar5;
  Vec_Ptr_t *pVVar6;
  undefined8 in_RDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  int iVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  
  pAVar3 = p->pNode->pNtk;
  if ((pAVar3->vTravIds).pArray == (int *)0x0) {
    iVar8 = pAVar3->vObjs->nSize;
    uVar1 = (long)iVar8 + 500;
    iVar7 = (int)uVar1;
    if ((pAVar3->vTravIds).nCap < iVar7) {
      piVar5 = (int *)malloc(uVar1 * 4);
      (pAVar3->vTravIds).pArray = piVar5;
      if (piVar5 == (int *)0x0) goto LAB_0048b705;
      (pAVar3->vTravIds).nCap = iVar7;
      in_RDX = extraout_RDX;
    }
    else {
      piVar5 = (int *)0x0;
    }
    if (-500 < iVar8) {
      memset(piVar5,0,(uVar1 & 0xffffffff) << 2);
      in_RDX = extraout_RDX_00;
    }
    (pAVar3->vTravIds).nSize = iVar7;
    iVar8 = pAVar3->nTravIds;
    pAVar3->nTravIds = iVar8 + 1;
    if (0x3ffffffe < iVar8) goto LAB_0048b6e6;
    if (piVar5 == (int *)0x0) {
      iVar7 = pAVar3->vObjs->nSize;
      uVar1 = (long)iVar7 + 500;
      iVar9 = (int)uVar1;
      if ((pAVar3->vTravIds).nCap < iVar9) {
        piVar5 = (int *)malloc(uVar1 * 4);
        (pAVar3->vTravIds).pArray = piVar5;
        if (piVar5 == (int *)0x0) {
LAB_0048b705:
          __assert_fail("p->pArray",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                        ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
        }
        (pAVar3->vTravIds).nCap = iVar9;
        in_RDX = extraout_RDX_01;
      }
      else {
        piVar5 = (int *)0x0;
      }
      if (-500 < iVar7) {
        memset(piVar5,0,(uVar1 & 0xffffffff) << 2);
        in_RDX = extraout_RDX_02;
      }
      (pAVar3->vTravIds).nSize = iVar9;
    }
  }
  else {
    iVar8 = pAVar3->nTravIds;
    pAVar3->nTravIds = iVar8 + 1;
    if (0x3ffffffe < iVar8) goto LAB_0048b6e6;
  }
  pAVar3->nTravIds = iVar8 + 2;
  if (iVar8 != 0x3ffffffe) {
    pVVar6 = p->vLeaves;
    if (0 < pVVar6->nSize) {
      lVar10 = 0;
      do {
        lVar4 = *pVVar6->pArray[lVar10];
        iVar8 = (int)*(long *)((long)pVVar6->pArray[lVar10] + 0x10);
        uVar2 = *(undefined4 *)(lVar4 + 0xd8);
        Vec_IntFillExtra((Vec_Int_t *)(lVar4 + 0xe0),iVar8 + 1,(int)in_RDX);
        if (((long)iVar8 < 0) || (*(int *)(lVar4 + 0xe4) <= iVar8)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                        ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        *(undefined4 *)(*(long *)(lVar4 + 0xe8) + (long)iVar8 * 4) = uVar2;
        lVar10 = lVar10 + 1;
        pVVar6 = p->vLeaves;
        in_RDX = extraout_RDX_03;
      } while (lVar10 < pVVar6->nSize);
    }
    pVVar6 = p->vRoots;
    if (0 < pVVar6->nSize) {
      lVar10 = 0;
      do {
        Res_WinMarkPaths_rec((Abc_Obj_t *)pVVar6->pArray[lVar10],p->pNode,p->nLevTravMin);
        lVar10 = lVar10 + 1;
        pVVar6 = p->vRoots;
      } while (lVar10 < pVVar6->nSize);
    }
    return;
  }
LAB_0048b6e6:
  __assert_fail("p->nTravIds < (1<<30)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abc.h"
                ,0x198,"void Abc_NtkIncrementTravId(Abc_Ntk_t *)");
}

Assistant:

void Res_WinMarkPaths( Res_Win_t * p )
{
    Abc_Obj_t * pObj;
    int i;
    // mark the leaves
    Abc_NtkIncrementTravId( p->pNode->pNtk );
    Abc_NtkIncrementTravId( p->pNode->pNtk );
    Vec_PtrForEachEntry( Abc_Obj_t *, p->vLeaves, pObj, i )
        Abc_NodeSetTravIdCurrent( pObj );
    // traverse from the roots and mark the nodes that can reach leaves
    // the nodes that do not reach leaves have previous trav ID
    // the nodes that reach leaves have current trav ID
    Vec_PtrForEachEntry( Abc_Obj_t *, p->vRoots, pObj, i )
        Res_WinMarkPaths_rec( pObj, p->pNode, p->nLevTravMin );
}